

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_create_ghosts_irreg_config
                  (Integer type,Integer ndim,Integer *dims,Integer *width,char *array_name,
                  Integer *map,Integer *nblock,Integer p_handle,Integer *g_a)

{
  Integer g_a_00;
  logical lVar1;
  Integer *in_RCX;
  Integer *in_RDX;
  Integer in_RSI;
  Integer in_R8;
  Integer *in_R9;
  Integer g_A;
  logical status;
  Integer in_stack_00000520;
  char *in_stack_ffffffffffffffb8;
  Integer in_stack_ffffffffffffffc0;
  Integer *in_stack_ffffffffffffffc8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_pgroup_sync(in_stack_ffffffffffffffc0);
  g_a_00 = pnga_create_handle();
  *map = g_a_00;
  pnga_set_data((Integer)in_RCX,in_R8,in_R9,(Integer)in_stack_ffffffffffffffc8);
  pnga_set_ghosts((Integer)in_R9,in_stack_ffffffffffffffc8);
  pnga_set_array_name(g_a_00,in_stack_ffffffffffffffb8);
  pnga_set_irreg_distr(in_RSI,in_RDX,in_RCX);
  pnga_set_pgroup(g_a_00,(Integer)in_stack_ffffffffffffffb8);
  lVar1 = pnga_allocate(in_stack_00000520);
  return lVar1;
}

Assistant:

logical pnga_create_ghosts_irreg_config(
        Integer type,     /* MA type */
        Integer ndim,     /* number of dimensions */
        Integer *dims,    /* array of dimensions */
        Integer *width,   /* width of boundary cells for each dimension */
        char *array_name, /* array name */
        Integer *map,     /* decomposition map array */ 
        Integer *nblock,  /* number of blocks for each dimension in map */
        Integer p_handle, /* processor list handle */
        Integer *g_a)     /* array handle (output) */
{
  logical status;
  Integer g_A;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  pnga_pgroup_sync(p_handle);

  g_A = pnga_create_handle();
  *g_a = g_A;
  pnga_set_data(g_A,ndim,dims,type);
  pnga_set_ghosts(g_A,width);
  pnga_set_array_name(g_A,array_name);
  pnga_set_irreg_distr(g_A,map,nblock);
  pnga_set_pgroup(g_A,p_handle);
  status = pnga_allocate(g_A);

  return status;
}